

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2.test.cpp
# Opt level: O3

void verifyIncoherentElastic(Type<7,_2> *chunk)

{
  bool bVar1;
  variant_alternative_t<1UL,_variant<CoherentElastic,_IncoherentElastic,_MixedElastic>_> *pvVar2;
  long lVar3;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_7_2_src_NC_hpp:6:25),_const_std::variant<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>_&>
  _Var4;
  ScatteringLaw *__variants;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  AssertionHandler catchAssertionHandler_8;
  IncoherentElastic law;
  undefined1 local_178 [8];
  undefined8 local_170;
  char *local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160 [2];
  bool local_13d;
  IResultCapture *local_138;
  undefined1 local_130 [8];
  undefined8 local_128;
  ITransientExpression *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [2];
  double local_f8;
  anon_class_1_0_00000001 local_ea;
  anon_class_1_0_00000001 local_e9;
  ITransientExpression local_e8;
  double *local_d8;
  WithinRelMatcher *local_d0;
  undefined1 local_c8 [48];
  undefined1 local_98 [16];
  IResultCapture *local_88;
  vector<long,_std::allocator<long>_> local_80;
  vector<double,_std::allocator<double>_> local_68;
  vector<double,_std::allocator<double>_> local_50;
  
  local_178 = (undefined1  [8])0x1af4b4;
  local_170 = (pointer)0x243;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0xf;
  capturedExpression.m_start = "2 == chunk.MT()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName,(SourceLineInfo *)local_178,capturedExpression,
             ContinueOnFailure);
  local_170._0_2_ = 0x101;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4310;
  local_170._4_4_ = 2;
  local_168 = "==";
  local_160[0]._M_allocated_capacity = 2;
  local_160[0]._8_4_ = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1af4b4;
  local_170 = (pointer)0x244;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x1a;
  capturedExpression_00.m_start = "2 == chunk.sectionNumber()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_00,(SourceLineInfo *)local_178,
             capturedExpression_00,ContinueOnFailure);
  local_170._0_2_ = 0x101;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4310;
  local_170._4_4_ = 2;
  local_168 = "==";
  local_160[0]._M_allocated_capacity = 2;
  local_160[0]._8_4_ = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1af4b4;
  local_170 = (pointer)0x246;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x11;
  capturedExpression_01.m_start = "107 == chunk.ZA()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_01,(SourceLineInfo *)local_178,
             capturedExpression_01,ContinueOnFailure);
  local_160[0]._8_4_ = (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<7,_2>_>).ZA_;
  local_170._1_1_ = local_160[0]._8_4_ == 0x6b;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4310;
  local_170._4_4_ = 0x6b;
  local_168 = "==";
  local_160[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1af4b4;
  local_170 = (pointer)0x247;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x1f;
  capturedExpression_02.m_start = "107 == chunk.targetIdentifier()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_02,(SourceLineInfo *)local_178,
             capturedExpression_02,ContinueOnFailure);
  local_160[0]._8_4_ = (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<7,_2>_>).ZA_;
  local_170._1_1_ = local_160[0]._8_4_ == 0x6b;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4310;
  local_170._4_4_ = 0x6b;
  local_168 = "==";
  local_160[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1af4b4;
  local_170 = (pointer)0x248;
  macroName_03.m_size = 10;
  macroName_03.m_start = "CHECK_THAT";
  capturedExpression_03.m_size = 0x1c;
  capturedExpression_03.m_start = "1., WithinRel( chunk.AWR() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_03,(SourceLineInfo *)local_178,
             capturedExpression_03,ContinueOnFailure);
  local_e8._vptr_ITransientExpression = (_func_int **)0x3ff0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<7,_2>_>).atomicWeightRatio_);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_e8);
  local_128._1_1_ = bVar1;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  local_120 = &local_e8;
  local_118[0]._0_8_ = (WithinRelMatcher *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1af4b4;
  local_170 = (pointer)0x249;
  macroName_04.m_size = 10;
  macroName_04.m_start = "CHECK_THAT";
  capturedExpression_04.m_size = 0x2a;
  capturedExpression_04.m_start = "1., WithinRel( chunk.atomicWeightRatio() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_04,(SourceLineInfo *)local_178,
             capturedExpression_04,ContinueOnFailure);
  local_e8._vptr_ITransientExpression = (_func_int **)0x3ff0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<7,_2>_>).atomicWeightRatio_);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_e8);
  local_128._1_1_ = bVar1;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4350;
  local_120 = &local_e8;
  local_118[0]._0_8_ = (WithinRelMatcher *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1af4b4;
  local_170 = (pointer)0x24a;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0x11;
  capturedExpression_05.m_start = "2 == chunk.LTHR()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_05,(SourceLineInfo *)local_178,
             capturedExpression_05,ContinueOnFailure);
  __variants = &chunk->law_;
  local_160[0]._8_4_ =
       std::
       visit<njoy::ENDFtk::section::Type<7,2>::LTHR()const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<7,2>::CoherentElastic,njoy::ENDFtk::section::Type<7,2>::IncoherentElastic,njoy::ENDFtk::section::Type<7,2>::MixedElastic>const&>
                 (&local_ea,__variants);
  local_170._1_1_ = local_160[0]._8_4_ == 2;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4310;
  local_170._4_4_ = 2;
  local_168 = "==";
  local_160[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1af4b4;
  local_170 = (pointer)0x24b;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x22;
  capturedExpression_06.m_start = "2 == chunk.elasticScatteringType()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c8,macroName_06,(SourceLineInfo *)local_178,
             capturedExpression_06,ContinueOnFailure);
  local_160[0]._8_4_ =
       std::
       visit<njoy::ENDFtk::section::Type<7,2>::LTHR()const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<7,2>::CoherentElastic,njoy::ENDFtk::section::Type<7,2>::IncoherentElastic,njoy::ENDFtk::section::Type<7,2>::MixedElastic>const&>
                 (&local_e9,__variants);
  local_170._1_1_ = local_160[0]._8_4_ == 2;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4310;
  local_170._4_4_ = 2;
  local_168 = "==";
  local_160[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c8);
  if (local_98[0xb] == false) {
    (*local_88->_vptr_IResultCapture[0x13])();
  }
  pvVar2 = std::
           get<1ul,njoy::ENDFtk::section::Type<7,2>::CoherentElastic,njoy::ENDFtk::section::Type<7,2>::IncoherentElastic,njoy::ENDFtk::section::Type<7,2>::MixedElastic>
                     (__variants);
  local_c8._0_8_ =
       *(undefined8 *)
        &(pvVar2->super_TabulationRecord).super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>;
  local_c8._8_8_ =
       (pvVar2->super_TabulationRecord).super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
  local_c8._16_8_ =
       (pvVar2->super_TabulationRecord).super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  local_c8._24_8_ =
       (pvVar2->super_TabulationRecord).super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  local_c8._32_8_ =
       (pvVar2->super_TabulationRecord).super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  local_c8._40_8_ =
       (pvVar2->super_TabulationRecord).super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_98,
             &(pvVar2->super_TabulationRecord).super_InterpolationBase.boundaryIndices);
  std::vector<long,_std::allocator<long>_>::vector
            (&local_80,
             &(pvVar2->super_TabulationRecord).super_InterpolationBase.interpolationSchemeIndices);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_68,&(pvVar2->super_TabulationRecord).xValues);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_50,&(pvVar2->super_TabulationRecord).yValues);
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x24f;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0xf;
  capturedExpression_07.m_start = "2 == law.LTHR()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_07,(SourceLineInfo *)local_130,
             capturedExpression_07,ContinueOnFailure);
  local_128._0_2_ = 0x101;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4310;
  local_128._4_4_ = 2;
  local_120 = (ITransientExpression *)0x1b21a7;
  local_118[0]._M_allocated_capacity = 2;
  local_118[0]._8_4_ = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x250;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x20;
  capturedExpression_08.m_start = "2 == law.elasticScatteringType()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_08,(SourceLineInfo *)local_130,
             capturedExpression_08,ContinueOnFailure);
  local_128._0_2_ = 0x101;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4310;
  local_128._4_4_ = 2;
  local_120 = (ITransientExpression *)0x1b21a7;
  local_118[0]._M_allocated_capacity = 2;
  local_118[0]._8_4_ = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x251;
  macroName_09.m_size = 10;
  macroName_09.m_start = "CHECK_THAT";
  capturedExpression_09.m_size = 0x22;
  capturedExpression_09.m_start = "8.198006e+1, WithinRel( law.SB() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_09,(SourceLineInfo *)local_130,
             capturedExpression_09,ContinueOnFailure);
  local_f8 = 81.98006;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_130,(double)local_c8._40_8_);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_130,&local_f8);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f4350;
  local_d8 = &local_f8;
  local_d0 = (WithinRelMatcher *)local_130;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_178,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x252;
  macroName_10.m_size = 10;
  macroName_10.m_start = "CHECK_THAT";
  capturedExpression_10.m_size = 0x31;
  capturedExpression_10.m_start = "8.198006e+1, WithinRel( law.boundCrossSection() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_10,(SourceLineInfo *)local_130,
             capturedExpression_10,ContinueOnFailure);
  local_f8 = 81.98006;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_130,(double)local_c8._40_8_);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_130,&local_f8);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f4350;
  local_d8 = &local_f8;
  local_d0 = (WithinRelMatcher *)local_130;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_178,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x253;
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  capturedExpression_11.m_size = 0xd;
  capturedExpression_11.m_start = "3 == law.NP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_11,(SourceLineInfo *)local_130,
             capturedExpression_11,ContinueOnFailure);
  local_118[0]._8_8_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_128._1_1_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x18;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_128._4_4_ = 3;
  local_120 = (ITransientExpression *)0x1b21a7;
  local_118[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x254;
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  capturedExpression_12.m_size = 0x17;
  capturedExpression_12.m_start = "3 == law.numberPoints()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_12,(SourceLineInfo *)local_130,
             capturedExpression_12,ContinueOnFailure);
  local_118[0]._8_8_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_128._1_1_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x18;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_128._4_4_ = 3;
  local_120 = (ITransientExpression *)0x1b21a7;
  local_118[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x255;
  macroName_13.m_size = 5;
  macroName_13.m_start = "CHECK";
  capturedExpression_13.m_size = 0x1d;
  capturedExpression_13.m_start = "3 == law.numberTemperatures()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_13,(SourceLineInfo *)local_130,
             capturedExpression_13,ContinueOnFailure);
  local_118[0]._8_8_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_128._1_1_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x18;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_128._4_4_ = 3;
  local_120 = (ITransientExpression *)0x1b21a7;
  local_118[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x256;
  macroName_14.m_size = 5;
  macroName_14.m_start = "CHECK";
  capturedExpression_14.m_size = 0xd;
  capturedExpression_14.m_start = "1 == law.NR()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_14,(SourceLineInfo *)local_130,
             capturedExpression_14,ContinueOnFailure);
  lVar3 = CONCAT44(local_98._12_4_,local_98._8_4_) - local_98._0_8_;
  local_118[0]._8_8_ = lVar3 >> 3;
  local_128._1_1_ = lVar3 == 8;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_128._4_4_ = 1;
  local_120 = (ITransientExpression *)0x1b21a7;
  local_118[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x257;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x25;
  capturedExpression_15.m_start = "1 == law.numberInterpolationRegions()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_15,(SourceLineInfo *)local_130,
             capturedExpression_15,ContinueOnFailure);
  lVar3 = CONCAT44(local_98._12_4_,local_98._8_4_) - local_98._0_8_;
  local_118[0]._8_8_ = lVar3 >> 3;
  local_128._1_1_ = lVar3 == 8;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_128._4_4_ = 1;
  local_120 = (ITransientExpression *)0x1b21a7;
  local_118[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x258;
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  capturedExpression_16.m_size = 0x15;
  capturedExpression_16.m_start = "1 == law.INT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_16,(SourceLineInfo *)local_130,
             capturedExpression_16,ContinueOnFailure);
  local_118[0]._8_8_ =
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_128._1_1_ =
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start == 8;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_128._4_4_ = 1;
  local_120 = (ITransientExpression *)0x1b21a7;
  local_118[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x259;
  macroName_17.m_size = 5;
  macroName_17.m_start = "CHECK";
  capturedExpression_17.m_size = 0x15;
  capturedExpression_17.m_start = "1 == law.NBT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_17,(SourceLineInfo *)local_130,
             capturedExpression_17,ContinueOnFailure);
  lVar3 = CONCAT44(local_98._12_4_,local_98._8_4_) - local_98._0_8_;
  local_118[0]._8_8_ = lVar3 >> 3;
  local_128._1_1_ = lVar3 == 8;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_128._4_4_ = 1;
  local_120 = (ITransientExpression *)0x1b21a7;
  local_118[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x25a;
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  capturedExpression_18.m_size = 0x11;
  capturedExpression_18.m_start = "2 == law.INT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_18,(SourceLineInfo *)local_130,
             capturedExpression_18,ContinueOnFailure);
  local_118[0]._8_8_ =
       *local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start;
  local_128._1_1_ = local_118[0]._8_8_ == 2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_128._4_4_ = 2;
  local_120 = (ITransientExpression *)0x1b21a7;
  local_118[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x25b;
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  capturedExpression_19.m_size = 0x11;
  capturedExpression_19.m_start = "3 == law.NBT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_19,(SourceLineInfo *)local_130,
             capturedExpression_19,ContinueOnFailure);
  local_118[0]._8_8_ = *(undefined8 *)local_98._0_8_;
  local_128._1_1_ = local_118[0]._8_8_ == 3;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_128._4_4_ = 3;
  local_120 = (ITransientExpression *)0x1b21a7;
  local_118[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x25c;
  macroName_20.m_size = 5;
  macroName_20.m_start = "CHECK";
  capturedExpression_20.m_size = 0x1e;
  capturedExpression_20.m_start = "1 == law.interpolants().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_20,(SourceLineInfo *)local_130,
             capturedExpression_20,ContinueOnFailure);
  local_118[0]._8_8_ =
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_128._1_1_ =
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start == 8;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_128._4_4_ = 1;
  local_120 = (ITransientExpression *)0x1b21a7;
  local_118[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x25d;
  macroName_21.m_size = 5;
  macroName_21.m_start = "CHECK";
  capturedExpression_21.m_size = 0x1c;
  capturedExpression_21.m_start = "1 == law.boundaries().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_21,(SourceLineInfo *)local_130,
             capturedExpression_21,ContinueOnFailure);
  lVar3 = CONCAT44(local_98._12_4_,local_98._8_4_) - local_98._0_8_;
  local_118[0]._8_8_ = lVar3 >> 3;
  local_128._1_1_ = lVar3 == 8;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_128._4_4_ = 1;
  local_120 = (ITransientExpression *)0x1b21a7;
  local_118[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x25e;
  macroName_22.m_size = 5;
  macroName_22.m_start = "CHECK";
  capturedExpression_22.m_size = 0x1a;
  capturedExpression_22.m_start = "2 == law.interpolants()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_22,(SourceLineInfo *)local_130,
             capturedExpression_22,ContinueOnFailure);
  local_118[0]._8_8_ =
       *local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start;
  local_128._1_1_ = local_118[0]._8_8_ == 2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_128._4_4_ = 2;
  local_120 = (ITransientExpression *)0x1b21a7;
  local_118[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x25f;
  macroName_23.m_size = 5;
  macroName_23.m_start = "CHECK";
  capturedExpression_23.m_size = 0x18;
  capturedExpression_23.m_start = "3 == law.boundaries()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_23,(SourceLineInfo *)local_130,
             capturedExpression_23,ContinueOnFailure);
  local_118[0]._8_8_ = *(undefined8 *)local_98._0_8_;
  local_128._1_1_ = local_118[0]._8_8_ == 3;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_128._4_4_ = 3;
  local_120 = (ITransientExpression *)0x1b21a7;
  local_118[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x260;
  macroName_24.m_size = 5;
  macroName_24.m_start = "CHECK";
  capturedExpression_24.m_size = 0x1e;
  capturedExpression_24.m_start = "3 == law.temperatures().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_24,(SourceLineInfo *)local_130,
             capturedExpression_24,ContinueOnFailure);
  local_118[0]._8_8_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_128._1_1_ =
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x18;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_128._4_4_ = 3;
  local_120 = (ITransientExpression *)0x1b21a7;
  local_118[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x261;
  macroName_25.m_size = 5;
  macroName_25.m_start = "CHECK";
  capturedExpression_25.m_size = 0x23;
  capturedExpression_25.m_start = "3 == law.debyeWallerValues().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_25,(SourceLineInfo *)local_130,
             capturedExpression_25,ContinueOnFailure);
  local_118[0]._8_8_ =
       (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_128._1_1_ =
       (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x18;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001f43d0;
  local_128._4_4_ = 3;
  local_120 = (ITransientExpression *)0x1b21a7;
  local_118[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x262;
  macroName_26.m_size = 10;
  macroName_26.m_start = "CHECK_THAT";
  capturedExpression_26.m_size = 0x28;
  capturedExpression_26.m_start = "296., WithinRel( law.temperatures()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_26,(SourceLineInfo *)local_130,
             capturedExpression_26,ContinueOnFailure);
  local_f8 = 296.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_130,
             *local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_130,&local_f8);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f4350;
  local_d8 = &local_f8;
  local_d0 = (WithinRelMatcher *)local_130;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_178,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x263;
  macroName_27.m_size = 10;
  macroName_27.m_start = "CHECK_THAT";
  capturedExpression_27.m_size = 0x28;
  capturedExpression_27.m_start = "400., WithinRel( law.temperatures()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_27,(SourceLineInfo *)local_130,
             capturedExpression_27,ContinueOnFailure);
  local_f8 = 400.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_130,
             local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_130,&local_f8);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f4350;
  local_d8 = &local_f8;
  local_d0 = (WithinRelMatcher *)local_130;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_178,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x264;
  macroName_28.m_size = 10;
  macroName_28.m_start = "CHECK_THAT";
  capturedExpression_28.m_size = 0x28;
  capturedExpression_28.m_start = "500., WithinRel( law.temperatures()[2] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_28,(SourceLineInfo *)local_130,
             capturedExpression_28,ContinueOnFailure);
  local_f8 = 500.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_130,
             local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2]);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_130,&local_f8);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f4350;
  local_d8 = &local_f8;
  local_d0 = (WithinRelMatcher *)local_130;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_178,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x265;
  macroName_29.m_size = 10;
  macroName_29.m_start = "CHECK_THAT";
  capturedExpression_29.m_size = 0x34;
  capturedExpression_29.m_start = "8.486993e+0, WithinRel( law.debyeWallerValues()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_29,(SourceLineInfo *)local_130,
             capturedExpression_29,ContinueOnFailure);
  local_f8 = 8.486993;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_130,
             *local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_130,&local_f8);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f4350;
  local_d8 = &local_f8;
  local_d0 = (WithinRelMatcher *)local_130;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_178,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x266;
  macroName_30.m_size = 10;
  macroName_30.m_start = "CHECK_THAT";
  capturedExpression_30.m_size = 0x34;
  capturedExpression_30.m_start = "9.093191e+0, WithinRel( law.debyeWallerValues()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_30,(SourceLineInfo *)local_130,
             capturedExpression_30,ContinueOnFailure);
  local_f8 = 9.093191;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_130,
             local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_130,&local_f8);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f4350;
  local_d8 = &local_f8;
  local_d0 = (WithinRelMatcher *)local_130;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_178,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x267;
  macroName_31.m_size = 10;
  macroName_31.m_start = "CHECK_THAT";
  capturedExpression_31.m_size = 0x34;
  capturedExpression_31.m_start = "9.828159e+0, WithinRel( law.debyeWallerValues()[2] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_31,(SourceLineInfo *)local_130,
             capturedExpression_31,ContinueOnFailure);
  local_f8 = 9.828159;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_130,
             local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2]);
  local_e8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_130,&local_f8);
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f4350;
  local_d8 = &local_f8;
  local_d0 = (WithinRelMatcher *)local_130;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_178,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1af4b4;
  local_128 = (pointer)0x269;
  macroName_32.m_size = 5;
  macroName_32.m_start = "CHECK";
  capturedExpression_32.m_size = 0xf;
  capturedExpression_32.m_start = "4 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_32,(SourceLineInfo *)local_130,
             capturedExpression_32,ContinueOnFailure);
  _Var4 = std::
          visit<njoy::ENDFtk::section::Type<7,2>::NC()const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<7,2>::CoherentElastic,njoy::ENDFtk::section::Type<7,2>::IncoherentElastic,njoy::ENDFtk::section::Type<7,2>::MixedElastic>const&>
                    ((anon_class_1_0_00000001 *)&local_e8,__variants);
  local_118[0]._8_8_ = _Var4 + 1;
  local_128._1_1_ = local_118[0]._8_8_ == 4;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001f4390;
  local_128._4_4_ = 4;
  local_120 = (ITransientExpression *)0x1b21a7;
  local_118[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((long *)local_98._0_8_ != (long *)0x0) {
    operator_delete((void *)local_98._0_8_,(long)local_88 - local_98._0_8_);
  }
  return;
}

Assistant:

void verifyIncoherentElastic( const section::Type< 7, 2 >& chunk ) {

  CHECK( 2 == chunk.MT() );
  CHECK( 2 == chunk.sectionNumber() );

  CHECK( 107 == chunk.ZA() );
  CHECK( 107 == chunk.targetIdentifier() );
  CHECK_THAT( 1., WithinRel( chunk.AWR() ) );
  CHECK_THAT( 1., WithinRel( chunk.atomicWeightRatio() ) );
  CHECK( 2 == chunk.LTHR() );
  CHECK( 2 == chunk.elasticScatteringType() );

  auto law =
       std::get< IncoherentElastic >( chunk.scatteringLaw() );
  CHECK( 2 == law.LTHR() );
  CHECK( 2 == law.elasticScatteringType() );
  CHECK_THAT( 8.198006e+1, WithinRel( law.SB() ) );
  CHECK_THAT( 8.198006e+1, WithinRel( law.boundCrossSection() ) );
  CHECK( 3 == law.NP() );
  CHECK( 3 == law.numberPoints() );
  CHECK( 3 == law.numberTemperatures() );
  CHECK( 1 == law.NR() );
  CHECK( 1 == law.numberInterpolationRegions() );
  CHECK( 1 == law.INT().size() );
  CHECK( 1 == law.NBT().size() );
  CHECK( 2 == law.INT()[0] );
  CHECK( 3 == law.NBT()[0] );
  CHECK( 1 == law.interpolants().size() );
  CHECK( 1 == law.boundaries().size() );
  CHECK( 2 == law.interpolants()[0] );
  CHECK( 3 == law.boundaries()[0] );
  CHECK( 3 == law.temperatures().size() );
  CHECK( 3 == law.debyeWallerValues().size() );
  CHECK_THAT( 296., WithinRel( law.temperatures()[0] ) );
  CHECK_THAT( 400., WithinRel( law.temperatures()[1] ) );
  CHECK_THAT( 500., WithinRel( law.temperatures()[2] ) );
  CHECK_THAT( 8.486993e+0, WithinRel( law.debyeWallerValues()[0] ) );
  CHECK_THAT( 9.093191e+0, WithinRel( law.debyeWallerValues()[1] ) );
  CHECK_THAT( 9.828159e+0, WithinRel( law.debyeWallerValues()[2] ) );

  CHECK( 4 == chunk.NC() );
}